

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall
APowerDamage::ModifyDamage
          (APowerDamage *this,int damage,FName *damageType,int *newdamage,bool passive)

{
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_00;
  uint uVar1;
  bool bVar2;
  hash_t hVar3;
  int b;
  MetaClass *pMVar4;
  AActor *ent;
  AInventory *pAVar5;
  FName local_44;
  FSoundID local_40;
  FName local_3c;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *local_38;
  DmgFactors *df;
  int newdam;
  bool passive_local;
  int *newdamage_local;
  FName *damageType_local;
  APowerDamage *pAStack_10;
  int damage_local;
  APowerDamage *this_local;
  
  df._7_1_ = passive;
  _newdam = newdamage;
  newdamage_local = &damageType->Index;
  damageType_local._4_4_ = damage;
  pAStack_10 = this;
  if ((!passive) && (0 < damage)) {
    pMVar4 = AInventory::GetClass((AInventory *)this);
    local_38 = &((pMVar4->super_PClassActor).DamageFactors)->
                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>;
    if ((local_38 == (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)0x0) ||
       (hVar3 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CountUsed(local_38),
       this_00 = local_38, hVar3 == 0)) {
      df._0_4_ = damageType_local._4_4_ << 2;
    }
    else {
      FName::FName(&local_3c,damageType);
      b = DmgFactors::Apply((DmgFactors *)this_00,&local_3c,damageType_local._4_4_);
      df._0_4_ = MAX<int>(1,b);
    }
    bVar2 = TObjPtr<AActor>::operator!=
                      (&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
    if ((bVar2) && ((int)damageType_local._4_4_ < (int)df)) {
      ent = ::TObjPtr::operator_cast_to_AActor_
                      ((TObjPtr *)&(this->super_APowerup).super_AInventory.Owner);
      FSoundID::FSoundID(&local_40,
                         &(this->super_APowerup).super_AInventory.super_AActor.ActiveSound.
                          super_FSoundID);
      S_Sound(ent,5,&local_40,1.0,0.0);
    }
    *_newdam = (int)df;
  }
  bVar2 = TObjPtr<AInventory>::operator!=
                    (&(this->super_APowerup).super_AInventory.super_AActor.Inventory,
                     (AInventory *)0x0);
  if (bVar2) {
    pAVar5 = TObjPtr<AInventory>::operator->
                       (&(this->super_APowerup).super_AInventory.super_AActor.Inventory);
    uVar1 = damageType_local._4_4_;
    FName::FName(&local_44,damageType);
    (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
              (pAVar5,(ulong)uVar1,&local_44,_newdam,(ulong)(df._7_1_ & 1));
  }
  return;
}

Assistant:

void APowerDamage::ModifyDamage(int damage, FName damageType, int &newdamage, bool passive)
{
	if (!passive && damage > 0)
	{
		int newdam;
		DmgFactors *df = GetClass()->DamageFactors;
		if (df != NULL && df->CountUsed() != 0)
		{
			newdam = MAX(1, df->Apply(damageType, damage));// don't allow zero damage as result of an underflow
		}
		else
		{
			newdam = damage * 4;
		}
		if (Owner != NULL && newdam > damage) S_Sound(Owner, 5, ActiveSound, 1.0f, ATTN_NONE);
		newdamage = newdam;
	}
	if (Inventory != NULL) Inventory->ModifyDamage(damage, damageType, newdamage, passive);
}